

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O0

QStringList * __thiscall QIconLoader::fallbackSearchPaths(QIconLoader *this)

{
  long lVar1;
  bool bVar2;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  QList<QString> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar2 = QList<QString>::isEmpty((QList<QString> *)0x29dfc2);
  if (bVar2) {
    systemFallbackSearchPaths();
    QList<QString>::operator=(this_00,in_RDI);
    QList<QString>::~QList((QList<QString> *)0x29dff2);
  }
  QList<QString>::QList(this_00,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QStringList QIconLoader::fallbackSearchPaths() const
{
    if (m_fallbackDirs.isEmpty()) {
        m_fallbackDirs = systemFallbackSearchPaths();
    }
    return m_fallbackDirs;
}